

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dau_VerifyFile(char *pFileName)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  word wVar3;
  uint uVar4;
  ulong uVar5;
  uint uTruth2;
  char Buffer [1000];
  
  __stream = fopen(pFileName,"rb");
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    pcVar1 = fgets(Buffer,1000,__stream);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = strlen(Buffer);
    if (Buffer[sVar2 - 1] == '\n') {
      Buffer[sVar2 - 1] = '\0';
    }
    sVar2 = strlen(Buffer);
    if (Buffer[sVar2 - 1] == '\r') {
      Buffer[sVar2 - 1] = '\0';
    }
    Extra_ReadHexadecimal(&uTruth2,Buffer,5);
    wVar3 = Dau_ParseFormula(Buffer + 0xb);
    if (uTruth2 != (uint)wVar3) {
      printf("Verification failed in line %d:  %s\n",uVar5,Buffer);
      uVar4 = uVar4 + 1;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  printf("Verification succeeded for %d functions and failed for %d functions.\n",
         (ulong)((int)uVar5 - uVar4),(ulong)uVar4);
  return;
}

Assistant:

void Dau_VerifyFile( char * pFileName )
{
    char Buffer[1000];
    unsigned uTruth, uTruth2; 
    int nFails = 0, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Extra_ReadHexadecimal( &uTruth2, Buffer, 5 );
        uTruth = (unsigned)Dau_ParseFormula( Buffer + 11 );
        if ( uTruth != uTruth2 )
            printf( "Verification failed in line %d:  %s\n", nLines, Buffer ), nFails++;
        nLines++;
    }
    printf( "Verification succeeded for %d functions and failed for %d functions.\n", nLines-nFails, nFails );
}